

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O2

SafeInt<int> mp::operator-(SafeInt<int> a,SafeInt<int> b)

{
  undefined8 *puVar1;
  
  if (a.value_ < 0) {
    if ((int)(a.value_ & 0x7fffffffU) < b.value_) goto LAB_00109901;
  }
  else if (b.value_ < a.value_ + -0x7fffffff) {
LAB_00109901:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_0013c148;
    __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
  }
  return (SafeInt<int>)(a.value_ - b.value_);
}

Assistant:

inline SafeInt<T> operator-(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (a_value >= 0) {
    if (b_value < a_value - std::numeric_limits<T>::max())
      throw OverflowError();
  } else if (b_value > a_value - std::numeric_limits<T>::min())
    throw OverflowError();
  return a_value - b_value;
}